

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

int __thiscall QCss::Declaration::styleFeaturesValue(Declaration *this)

{
  bool bVar1;
  QVariant *other;
  DeclarationData *pDVar2;
  qsizetype qVar3;
  quint64 qVar4;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  int i;
  int features;
  QVariant *in_stack_ffffffffffffff70;
  int iVar5;
  uint uVar6;
  QVariant *name;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  QList<QCss::Value> *in_stack_ffffffffffffff98;
  QVariant local_50 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name = in_RDI;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ea40);
  bVar1 = ::QVariant::isValid(in_stack_ffffffffffffff70);
  if (bVar1) {
    pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ea5c
                       );
    uVar6 = ::QVariant::toInt((bool *)&pDVar2->parsed);
  }
  else {
    uVar6 = 0;
    iVar5 = 0;
    while( true ) {
      other = (QVariant *)(long)iVar5;
      pDVar2 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa2ea99);
      qVar3 = QList<QCss::Value>::size(&pDVar2->values);
      if (qVar3 <= (long)other) break;
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2eabc);
      QList<QCss::Value>::value
                (in_stack_ffffffffffffff98,
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      ::QVariant::toString();
      qVar4 = findKnownValue((QString *)name,(QCssKnownValue *)CONCAT44(uVar6,iVar5),
                             (int)((ulong)in_RDI >> 0x20));
      uVar6 = (uint)qVar4 | uVar6;
      QString::~QString((QString *)0xa2eb0d);
      Value::~Value((Value *)0xa2eb17);
      iVar5 = iVar5 + 1;
    }
    ::QVariant::QVariant(local_50,uVar6);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2eb3f);
    ::QVariant::operator=(in_RDI,other);
    ::QVariant::~QVariant(local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar6;
  }
  __stack_chk_fail();
}

Assistant:

int Declaration::styleFeaturesValue() const
{
    Q_ASSERT(d->propertyId == QtStyleFeatures);
    if (d->parsed.isValid())
        return d->parsed.toInt();
    int features = StyleFeature_None;
    for (int i = 0; i < d->values.size(); i++) {
        features |= static_cast<int>(findKnownValue(d->values.value(i).variant.toString(),
                                     styleFeatures, NumKnownStyleFeatures));
    }
    d->parsed = features;
    return features;
}